

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void __thiscall QWingedEdge::QWingedEdge(QWingedEdge *this,QPainterPath *subject,QPainterPath *clip)

{
  QPathSegments *this_00;
  long in_RDI;
  QWingedEdge *in_stack_00000048;
  QPainterPath *in_stack_00000058;
  QPathSegments *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QDataBuffer<QPathEdge> *in_stack_ffffffffffffffd0;
  
  QPainterPath::elementCount((QPainterPath *)in_stack_ffffffffffffffd0);
  QDataBuffer<QPathEdge>::QDataBuffer
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  this_00 = (QPathSegments *)(in_RDI + 0x18);
  QPainterPath::elementCount((QPainterPath *)this_00);
  QDataBuffer<QPathVertex>::QDataBuffer
            ((QDataBuffer<QPathVertex> *)this_00,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  QList<double>::QList((QList<double> *)0x5ceecb);
  QPainterPath::elementCount((QPainterPath *)this_00);
  QPathSegments::QPathSegments(this_00,in_stack_ffffffffffffffcc);
  QPathSegments::setPath
            (this_00,(QPainterPath *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  QPathSegments::addPath(in_stack_00000060,in_stack_00000058);
  intersectAndAdd(in_stack_00000048);
  return;
}

Assistant:

QWingedEdge::QWingedEdge(const QPainterPath &subject, const QPainterPath &clip) :
    m_edges(subject.elementCount()),
    m_vertices(subject.elementCount()),
    m_segments(subject.elementCount())
{
    m_segments.setPath(subject);
    m_segments.addPath(clip);

    intersectAndAdd();
}